

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O2

X509_EXTENSION * do_ext_i2d(X509V3_EXT_METHOD *method,int ext_nid,int crit,void *ext_struc)

{
  int len;
  ASN1_OCTET_STRING *str;
  X509_EXTENSION *pXVar1;
  uchar *ext_der;
  uchar *local_28;
  
  local_28 = (uchar *)0x0;
  len = ASN1_item_i2d((ASN1_VALUE *)ext_struc,&local_28,(ASN1_ITEM *)method->it);
  if (-1 < len) {
    str = ASN1_OCTET_STRING_new();
    if (str != (ASN1_OCTET_STRING *)0x0) {
      ASN1_STRING_set0(str,local_28,len);
      pXVar1 = X509_EXTENSION_create_by_NID((X509_EXTENSION **)0x0,ext_nid,crit,str);
      ASN1_OCTET_STRING_free(str);
      return (X509_EXTENSION *)pXVar1;
    }
    OPENSSL_free(local_28);
  }
  return (X509_EXTENSION *)0x0;
}

Assistant:

static X509_EXTENSION *do_ext_i2d(const X509V3_EXT_METHOD *method, int ext_nid,
                                  int crit, void *ext_struc) {
  // Convert the extension's internal representation to DER.
  unsigned char *ext_der = NULL;
  int ext_len = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(ext_struc),
                              &ext_der, ASN1_ITEM_ptr(method->it));
  if (ext_len < 0) {
    return NULL;
  }

  ASN1_OCTET_STRING *ext_oct = ASN1_OCTET_STRING_new();
  if (ext_oct == NULL) {
    OPENSSL_free(ext_der);
    return NULL;
  }
  ASN1_STRING_set0(ext_oct, ext_der, ext_len);

  X509_EXTENSION *ext =
      X509_EXTENSION_create_by_NID(NULL, ext_nid, crit, ext_oct);
  ASN1_OCTET_STRING_free(ext_oct);
  return ext;
}